

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseNodeFree(Fts5ExprNode *p)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != 0) {
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x28); iVar1 = iVar1 + 1) {
      sqlite3Fts5ParseNodeFree((Fts5ExprNode *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
    sqlite3Fts5ParseNearsetFree((Fts5ExprNearset *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    sqlite3_free((void *)0x26b398);
  }
  return;
}

Assistant:

static void sqlite3Fts5ParseNodeFree(Fts5ExprNode *p){
  if( p ){
    int i;
    for(i=0; i<p->nChild; i++){
      sqlite3Fts5ParseNodeFree(p->apChild[i]);
    }
    sqlite3Fts5ParseNearsetFree(p->pNear);
    sqlite3_free(p);
  }
}